

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonWorker.cpp
# Opt level: O1

void adios2::query::JsonUtil::ConstructTree(RangeTree *host,json *opO)

{
  bool bVar1;
  Relation RVar2;
  Op op;
  size_type sVar3;
  reference pvVar4;
  reference other;
  reference other_00;
  string valStr;
  const_iterator __end3;
  value_type rangeOs;
  string opStr;
  const_iterator __begin3;
  value_type relationStr;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  r;
  undefined1 local_158 [24];
  primitive_iterator_t local_140;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_138;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_118;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_108;
  undefined1 local_f8 [16];
  RangeTree local_e8;
  string local_b0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  string local_80;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  string local_50;
  
  local_e8._0_8_ = "value";
  sVar3 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const*&>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)opO,(char **)&local_e8);
  if ((int)sVar3 != 0) {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)opO,"value");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json(&local_90,pvVar4);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_50,&local_90);
    RVar2 = strToRelation(&local_50);
    host->m_Relation = RVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_e8._0_8_ = "range";
    sVar3 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::count<char_const*&>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)opO,(char **)&local_e8);
    if ((int)sVar3 != 0) {
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)opO,"range");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_118,pvVar4);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::cbegin((const_iterator *)&local_e8,&local_118);
      local_138.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_138.m_it.array_iterator._M_current = (pointer)0x0;
      local_138.m_it.object_iterator._M_node = (_Rb_tree_node_base *)0x0;
      if (local_118.m_type == array) {
        local_138.m_it.array_iterator._M_current =
             ((local_118.m_value.array)->
             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      else if (local_118.m_type == object) {
        local_138.m_it.object_iterator._M_node =
             &((local_118.m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        local_138.m_it.primitive_iterator.m_it = 1;
      }
      local_138.m_object = &local_118;
      while (bVar1 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::
                     operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                               ((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                 *)&local_e8,&local_138), !bVar1) {
        other = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_e8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&local_60,other);
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)&local_60,"value");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (local_158,pvVar4);
        pvVar4 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)&local_60,"compare");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::
        get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_108,pvVar4);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,CONCAT71(local_108._1_7_,local_108.m_type),
                   &((local_108.m_value.object)->_M_t)._M_impl.field_0x0 +
                   CONCAT71(local_108._1_7_,local_108.m_type));
        op = strToQueryOp(&local_b0);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_158._0_8_,
                   (value_t *)local_158._0_8_ + (long)(_Rb_tree_node_base *)local_158._8_8_);
        RangeTree::AddLeaf(host,op,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((undefined1 *)CONCAT71(local_108._1_7_,local_108.m_type) != local_f8) {
          operator_delete((undefined1 *)CONCAT71(local_108._1_7_,local_108.m_type));
        }
        if ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)local_158._0_8_ !=
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)(local_158 + 0x10)) {
          operator_delete((void *)local_158._0_8_);
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json(&local_60);
        if (*(char *)local_e8._0_8_ == '\x02') {
          local_e8.m_Leaves.
          super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((long)local_e8.m_Leaves.
                               super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 0x10);
        }
        else if (*(char *)local_e8._0_8_ == '\x01') {
          local_e8.m_Leaves.
          super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)std::_Rb_tree_increment
                                  ((_Rb_tree_node_base *)
                                   local_e8.m_Leaves.
                                   super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
          local_e8.m_Leaves.
          super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)((long)local_e8.m_Leaves.
                               super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_118);
    }
    local_e8._0_8_ = "op";
    sVar3 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ::count<char_const*&>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                        *)opO,(char **)&local_e8);
    if ((int)sVar3 != 0) {
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                           *)opO,"op");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json(&local_108,pvVar4);
      if (local_108.m_type == array) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::begin((iterator *)&local_138,&local_108);
        local_140.m_it = -0x8000000000000000;
        local_158._16_8_ = (pointer)0x0;
        local_158._8_8_ = (_Base_ptr)0x0;
        if (local_108.m_type == array) {
          local_158._16_8_ =
               ((local_108.m_value.array)->
               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
        }
        else if (local_108.m_type == object) {
          local_158._8_8_ = &((local_108.m_value.object)->_M_t)._M_impl.super__Rb_tree_header;
        }
        else {
          local_140.m_it = 1;
        }
        local_158._0_8_ = &local_108;
        while (bVar1 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ::
                       operator==<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                                 ((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)&local_138,
                                  (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                   *)local_158), !bVar1) {
          other_00 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)&local_138);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::basic_json(&local_118,other_00);
          local_e8._0_8_ = local_e8._0_8_ & 0xffffffff00000000;
          local_e8.m_SubNodes.
          super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e8.m_SubNodes.
          super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_e8.m_Leaves.
          super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_e8.m_SubNodes.
          super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8.m_Leaves.
          super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8.m_Leaves.
          super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ConstructTree(&local_e8,&local_118);
          std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>::
          push_back(&host->m_SubNodes,&local_e8);
          std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>::~vector
                    (&local_e8.m_SubNodes);
          std::vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>::~vector
                    (&local_e8.m_Leaves);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&local_118);
          if ((local_138.m_object)->m_type == array) {
            local_138.m_it.array_iterator._M_current = local_138.m_it.array_iterator._M_current + 1;
          }
          else if ((local_138.m_object)->m_type == object) {
            local_138.m_it.object_iterator._M_node =
                 (_Base_ptr)std::_Rb_tree_increment(local_138.m_it.object_iterator._M_node);
          }
          else {
            local_138.m_it.primitive_iterator.m_it = local_138.m_it.primitive_iterator.m_it + 1;
          }
        }
      }
      else {
        local_e8._0_8_ = local_e8._0_8_ & 0xffffffff00000000;
        local_e8.m_Leaves.
        super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.m_Leaves.
        super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.m_Leaves.
        super__Vector_base<adios2::query::Range,_std::allocator<adios2::query::Range>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_e8.m_SubNodes.
        super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_e8.m_SubNodes.
        super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e8.m_SubNodes.
        super__Vector_base<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ConstructTree(&local_e8,&local_108);
        std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>::push_back
                  (&host->m_SubNodes,&local_e8);
        std::vector<adios2::query::RangeTree,_std::allocator<adios2::query::RangeTree>_>::~vector
                  (&local_e8.m_SubNodes);
        std::vector<adios2::query::Range,_std::allocator<adios2::query::Range>_>::~vector
                  (&local_e8.m_Leaves);
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_108);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_90);
  }
  return;
}

Assistant:

void ConstructTree(adios2::query::RangeTree &host, nlohmann::json &opO)
{
    if (!HasEntry(opO, "value"))
        return;
    auto relationStr = opO["value"];
    host.SetRelation(adios2::query::strToRelation(relationStr));

    if (HasEntry(opO, "range"))
    {
        auto const rangeOs = opO["range"];
        for (auto r : rangeOs)
        {
            std::string valStr = r["value"];
            std::string opStr = r["compare"];
            host.AddLeaf(adios2::query::strToQueryOp(opStr), valStr);
        }
    }
    if (HasEntry(opO, "op"))
    {
        auto subOpO = opO["op"];
        if (subOpO.is_array())
        {
            for (auto sub : subOpO)
            {
                adios2::query::RangeTree subNode;
                ConstructTree(subNode, sub);
                host.AddNode(subNode);
            }
        }
        else
        {
            adios2::query::RangeTree subNode;
            ConstructTree(subNode, subOpO);
            host.AddNode(subNode);
        }
    }
}